

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::symbol_codec::assemble_output_buf(symbol_codec *this,bool support_arith)

{
  byte *pbVar1;
  short sVar2;
  output_symbol *poVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint num_bits;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  this->m_total_bits_written = 0;
  uVar9 = 0;
  if ((int)CONCAT71(in_register_00000031,support_arith) != 0) {
    if ((this->m_arith_output_buf).m_size == 0) {
      uVar9 = 0;
      put_bits(this,0,1);
    }
    else {
      put_bits(this,1,1);
      this->m_arith_value = 0;
      this->m_arith_length = 0xffffffff;
      lVar11 = 0;
      do {
        pbVar1 = (this->m_arith_output_buf).m_p + lVar11;
        lVar11 = lVar11 + 1;
        uVar9 = (uint)*pbVar1;
        this->m_arith_value = this->m_arith_value << 8 | uVar9;
        put_bits(this,uVar9,8);
      } while (lVar11 != 4);
      uVar9 = 4;
    }
  }
  if ((this->m_output_syms).m_size != 0) {
    uVar10 = 0;
    do {
      poVar3 = (this->m_output_syms).m_p;
      sVar2 = poVar3[uVar10].m_num_bits;
      if (sVar2 == -1) {
        uVar4 = this->m_arith_length;
        if (uVar4 < 0x1000000) {
          do {
            uVar8 = 0;
            if (uVar9 < (this->m_arith_output_buf).m_size) {
              uVar6 = (ulong)uVar9;
              uVar9 = uVar9 + 1;
              uVar8 = (uint)(this->m_arith_output_buf).m_p[uVar6];
            }
            put_bits(this,uVar8,8);
            uVar5 = this->m_arith_value << 8 | uVar8;
            this->m_arith_value = uVar5;
            uVar4 = this->m_arith_length << 8;
            this->m_arith_length = uVar4;
          } while (uVar4 < 0x1000000);
        }
        else {
          uVar5 = this->m_arith_value;
        }
        uVar7 = (uVar4 >> 0xb) * (uint)poVar3[uVar10].m_arith_prob0;
        bVar12 = uVar7 <= uVar5;
        if (bVar12) {
          this->m_arith_value = uVar5 - uVar7;
          uVar7 = uVar4 - uVar7;
        }
        this->m_arith_length = uVar7;
        if (poVar3[uVar10].m_bits != (uint)bVar12) {
          crnlib_assert("bit == sym.m_bits",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_symbol_codec.cpp"
                        ,0x5c3);
        }
      }
      else {
        if (sVar2 == -2) {
          uVar4 = -this->m_bit_count & 7;
          if (uVar4 == 0) goto LAB_0019b783;
          num_bits = 8 - uVar4;
          uVar8 = 0;
        }
        else {
          num_bits = (uint)sVar2;
          uVar8 = poVar3[uVar10].m_bits;
        }
        put_bits(this,uVar8,num_bits);
      }
LAB_0019b783:
      uVar10 = uVar10 + 1;
    } while (uVar10 < (this->m_output_syms).m_size);
  }
  put_bits(this,0,7);
  return;
}

Assistant:

void symbol_codec::assemble_output_buf(bool support_arith)
    {
        m_total_bits_written = 0;

        uint arith_buf_ofs = 0;

        if (support_arith)
        {
            if (m_arith_output_buf.size())
            {
                put_bits(1, 1);

                m_arith_length = cSymbolCodecArithMaxLen;
                m_arith_value = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint c = m_arith_output_buf[arith_buf_ofs++];
                    m_arith_value = (m_arith_value << 8) | c;
                    put_bits(c, 8);
                }
            }
            else
            {
                put_bits(0, 1);
            }
        }

        for (uint sym_index = 0; sym_index < m_output_syms.size(); sym_index++)
        {
            const output_symbol& sym = m_output_syms[sym_index];

            if (sym.m_num_bits == output_symbol::cAlignToByteSym)
            {
                put_bits_align_to_byte();
            }
            else if (sym.m_num_bits == output_symbol::cArithSym)
            {
                if (m_arith_length < cSymbolCodecArithMinLen)
                {
                    do
                    {
                        const uint c = (arith_buf_ofs < m_arith_output_buf.size()) ? m_arith_output_buf[arith_buf_ofs++] : 0;
                        put_bits(c, 8);
                        m_arith_value = (m_arith_value << 8) | c;
                    } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
                }

                //uint x = gArithProbMulTab[sym.m_arith_prob0 >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
                uint x = sym.m_arith_prob0 * (m_arith_length >> cSymbolCodecArithProbBits);
                uint bit = (m_arith_value >= x);

                if (bit == 0)
                {
                    m_arith_length = x;
                }
                else
                {
                    m_arith_value -= x;
                    m_arith_length -= x;
                }

                CRNLIB_VERIFY(bit == sym.m_bits);
            }
            else
            {
                put_bits(sym.m_bits, sym.m_num_bits);
            }
        }

        flush_bits();
    }